

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O3

PatternView * ZXing::QRCode::FindPattern(PatternView *__return_storage_ptr__,PatternView *view)

{
  double dVar1;
  ushort *puVar2;
  int iVar3;
  ushort uVar4;
  ushort *puVar5;
  PatternView local_40;
  
  iVar3 = view->_size;
  if (4 < iVar3) {
    puVar5 = view->_data;
    local_40._base = view->_base;
    local_40._end = view->_end;
    local_40._size = 5;
    local_40._data = puVar5;
    if (puVar5 == local_40._base + 1) {
      uVar4 = puVar5[4];
      if (puVar5[4] < *puVar5) {
        uVar4 = *puVar5;
      }
      if ((uint)uVar4 * 2 <= (uint)puVar5[2]) {
        uVar4 = puVar5[3];
        if (puVar5[3] < puVar5[1]) {
          uVar4 = puVar5[1];
        }
        if (uVar4 <= puVar5[2]) {
          dVar1 = IsPattern<true,5,7>(&local_40,(FixedPattern<5,_7,_false> *)PATTERN,0x7fffffff,0.1,
                                      0.0);
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
LAB_00183ed5:
            __return_storage_ptr__->_base = local_40._base;
            __return_storage_ptr__->_end = local_40._end;
            goto LAB_00183e7b;
          }
          puVar5 = view->_data;
          iVar3 = view->_size;
        }
      }
    }
    if (local_40._data < puVar5 + (long)iVar3 + -5) {
      puVar2 = local_40._data;
      do {
        uVar4 = puVar2[4];
        if (puVar2[4] < *puVar2) {
          uVar4 = *puVar2;
        }
        if ((uint)puVar2[2] < (uint)uVar4 * 2) {
LAB_00183e5e:
          puVar2 = puVar2 + 2;
          local_40._data = puVar2;
        }
        else {
          uVar4 = puVar2[3];
          if (puVar2[3] < puVar2[1]) {
            uVar4 = puVar2[1];
          }
          if (puVar2[2] < uVar4) goto LAB_00183e5e;
          dVar1 = IsPattern<true,5,7>(&local_40,(FixedPattern<5,_7,_false> *)PATTERN,
                                      (uint)puVar2[-1],0.1,0.0);
          if ((dVar1 != 0.0) || (NAN(dVar1))) goto LAB_00183ed5;
          puVar2 = local_40._data;
          if (local_40._data != (ushort *)0x0) goto LAB_00183e5e;
          puVar2 = (ushort *)0x0;
        }
      } while (puVar2 < puVar5 + (long)iVar3 + -5);
    }
  }
  local_40._data._0_4_ = 0;
  local_40._data._4_4_ = 0;
  local_40._size = 0;
  local_40._12_4_ = 0;
  __return_storage_ptr__->_base = (Iterator)0x0;
  __return_storage_ptr__->_end = (Iterator)0x0;
LAB_00183e7b:
  *(undefined4 *)&__return_storage_ptr__->_data = local_40._data._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->_data + 4) = local_40._data._4_4_;
  __return_storage_ptr__->_size = local_40._size;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_40._12_4_;
  return __return_storage_ptr__;
}

Assistant:

PatternView FindPattern(const PatternView& view)
{
	return FindLeftGuard<PATTERN.size()>(view, PATTERN.size(), [](const PatternView& view, int spaceInPixel) {
		// perform a fast plausability test for 1:1:3:1:1 pattern
		if (view[2] < 2 * std::max(view[0], view[4]) || view[2] < std::max(view[1], view[3]))
			return 0.;
		return IsPattern<E2E>(view, PATTERN, spaceInPixel, 0.1); // the requires 4, here we accept almost 0
	});
}